

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O0

void Fraig_ManProveMiter(Fraig_Man_t *p)

{
  Fraig_Node_t *pFVar1;
  int iVar2;
  uint uVar3;
  Fraig_Node_t *pNode1;
  abctime clk;
  int i;
  Fraig_Node_t *pNode;
  Fraig_Man_t *p_local;
  
  if (p->fTryProve != 0) {
    Abc_Clock();
    for (clk._4_4_ = 0; clk._4_4_ < p->vOutputs->nSize; clk._4_4_ = clk._4_4_ + 1) {
      pNode1 = (Fraig_Node_t *)((ulong)p->vOutputs->pArray[clk._4_4_] & 0xfffffffffffffffe);
      if (((pNode1 != p->pConst1) &&
          (iVar2 = Fraig_CompareSimInfo(pNode1,p->pConst1,p->nWordsRand,1), iVar2 != 0)) &&
         (iVar2 = Fraig_NodeIsEquivalent(p,p->pConst1,pNode1,-1,p->nSeconds), iVar2 != 0)) {
        pFVar1 = p->vOutputs->pArray[clk._4_4_];
        uVar3 = Fraig_NodeComparePhase(p->pConst1,pNode1);
        if (((uint)pFVar1 & 1) == uVar3) {
          p->vOutputs->pArray[clk._4_4_] = p->pConst1;
        }
        else {
          p->vOutputs->pArray[clk._4_4_] = (Fraig_Node_t *)((ulong)p->pConst1 ^ 1);
        }
      }
    }
  }
  return;
}

Assistant:

void Fraig_ManProveMiter( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;
    int i;
    abctime clk;

    if ( !p->fTryProve )
        return;
 
    clk = Abc_Clock();
    // consider all outputs of the multi-output miter
    for ( i = 0; i < p->vOutputs->nSize; i++ )
    {
        pNode = Fraig_Regular(p->vOutputs->pArray[i]);
        // skip already constant nodes
        if ( pNode == p->pConst1 )
            continue;
        // skip nodes that are different according to simulation
        if ( !Fraig_CompareSimInfo( pNode, p->pConst1, p->nWordsRand, 1 ) )
            continue;
        if ( Fraig_NodeIsEquivalent( p, p->pConst1, pNode, -1, p->nSeconds ) )
        {
            if ( Fraig_IsComplement(p->vOutputs->pArray[i]) ^ Fraig_NodeComparePhase(p->pConst1, pNode) )
                p->vOutputs->pArray[i] = Fraig_Not(p->pConst1);
            else
                p->vOutputs->pArray[i] = p->pConst1;
        }
    }
    if ( p->fVerboseP ) 
    {
//        ABC_PRT( "Final miter proof time", Abc_Clock() - clk );
    }
}